

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::DoubleRange::ByteSizeLong(DoubleRange *this)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = (ulong)(this->minvalue_ != 0.0);
  sVar2 = uVar1 * 9 + 9;
  if (this->maxvalue_ == 0.0) {
    sVar2 = uVar1 * 9;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t DoubleRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DoubleRange)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // double minValue = 1;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_minvalue = this->_internal_minvalue();
  uint64_t raw_minvalue;
  memcpy(&raw_minvalue, &tmp_minvalue, sizeof(tmp_minvalue));
  if (raw_minvalue != 0) {
    total_size += 1 + 8;
  }

  // double maxValue = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_maxvalue = this->_internal_maxvalue();
  uint64_t raw_maxvalue;
  memcpy(&raw_maxvalue, &tmp_maxvalue, sizeof(tmp_maxvalue));
  if (raw_maxvalue != 0) {
    total_size += 1 + 8;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}